

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

osfildef * bif_get_file(bifcxdef *ctx,int *fnump,int *bin_modep)

{
  runsdef *prVar1;
  runcxdef *prVar2;
  ulong uVar3;
  
  prVar1 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar1 + -1;
  prVar2 = ctx->bifcxrun;
  if (prVar1[-1].runstyp != '\x01') {
    prVar2->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3eb);
  }
  uVar3 = (prVar2->runcxsp->runsv).runsvnum;
  if ((uVar3 < 10) && (ctx->bifcxfile[uVar3].fp != (osfildef *)0x0)) {
    if (fnump != (int *)0x0) {
      *fnump = (int)uVar3;
    }
    if (bin_modep != (int *)0x0) {
      *bin_modep = ctx->bifcxfile[uVar3].flags & 1;
    }
    return ctx->bifcxfile[uVar3].fp;
  }
  prVar2->runcxerr->errcxptr->erraac = 0;
  runsign(ctx->bifcxrun,0x418);
}

Assistant:

static osfildef *bif_get_file(bifcxdef *ctx, int *fnump, int *bin_modep)
{
    long fnum;

    /* get the file number and make sure it's valid */
    fnum = runpopnum(ctx->bifcxrun);
    if (fnum < 0 || fnum >= BIFFILMAX || ctx->bifcxfile[fnum].fp == 0)
        runsig(ctx->bifcxrun, ERR_BADFILE);

    /* put the validated file number, if the caller wants it */
    if (fnump != 0)
        *fnump = (int)fnum;

    /* set the binary-mode flag, if the caller wants it */
    if (bin_modep != 0)
        *bin_modep = ((ctx->bifcxfile[fnum].flags & BIFFIL_F_BINARY) != 0);

    /* return the file array pointer */
    return ctx->bifcxfile[fnum].fp;
}